

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDIOAnalyzerSettings.cpp
# Opt level: O1

void __thiscall MDIOAnalyzerSettings::MDIOAnalyzerSettings(MDIOAnalyzerSettings *this)

{
  Channel *this_00;
  auto_ptr<AnalyzerSettingInterfaceChannel> *paVar1;
  AnalyzerSettingInterfaceChannel *pAVar2;
  AnalyzerSettingInterfaceChannel *pAVar3;
  ulong uVar4;
  Channel *pCVar5;
  uint uVar6;
  
  AnalyzerSettings::AnalyzerSettings(&this->super_AnalyzerSettings);
  *(undefined ***)this = &PTR__MDIOAnalyzerSettings_0010bd68;
  this_00 = &this->mMdioChannel;
  Channel::Channel(this_00,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  uVar4 = 0xffffffffffffffff;
  Channel::Channel(&this->mMdcChannel,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  paVar1 = &this->mMdioChannelInterface;
  (this->mMdioChannelInterface)._M_ptr = (AnalyzerSettingInterfaceChannel *)0x0;
  (this->mMdcChannelInterface)._M_ptr = (AnalyzerSettingInterfaceChannel *)0x0;
  pAVar3 = (AnalyzerSettingInterfaceChannel *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,uVar4);
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(pAVar3);
  pAVar2 = paVar1->_M_ptr;
  if (pAVar2 != pAVar3) {
    if (pAVar2 != (AnalyzerSettingInterfaceChannel *)0x0) {
      (**(code **)(*(long *)pAVar2 + 8))();
    }
    paVar1->_M_ptr = pAVar3;
  }
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)paVar1->_M_ptr,"MDIO");
  pCVar5 = this_00;
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)paVar1->_M_ptr);
  pAVar3 = (AnalyzerSettingInterfaceChannel *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pCVar5);
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(pAVar3);
  pAVar2 = (this->mMdcChannelInterface)._M_ptr;
  if (pAVar2 != pAVar3) {
    if (pAVar2 != (AnalyzerSettingInterfaceChannel *)0x0) {
      (**(code **)(*(long *)pAVar2 + 8))();
    }
    (this->mMdcChannelInterface)._M_ptr = pAVar3;
  }
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)(this->mMdcChannelInterface)._M_ptr,"MDC");
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)(this->mMdcChannelInterface)._M_ptr);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  uVar6 = (uint)this;
  AnalyzerSettings::AddExportOption(uVar6,(char *)0x0);
  AnalyzerSettings::AddExportExtension(uVar6,(char *)0x0,"text");
  AnalyzerSettings::AddExportExtension(uVar6,(char *)0x0,"csv");
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)this_00,true);
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mMdcChannel,true);
  return;
}

Assistant:

MDIOAnalyzerSettings::MDIOAnalyzerSettings() : mMdioChannel( UNDEFINED_CHANNEL ), mMdcChannel( UNDEFINED_CHANNEL )
{
    mMdioChannelInterface.reset( new AnalyzerSettingInterfaceChannel() );
    mMdioChannelInterface->SetTitleAndTooltip( "MDIO", "MDIO data bus" );
    mMdioChannelInterface->SetChannel( mMdioChannel );

    mMdcChannelInterface.reset( new AnalyzerSettingInterfaceChannel() );
    mMdcChannelInterface->SetTitleAndTooltip( "MDC", "MDIO clock line " );
    mMdcChannelInterface->SetChannel( mMdcChannel );

    AddInterface( mMdioChannelInterface.get() );
    AddInterface( mMdcChannelInterface.get() );

    AddExportOption( 0, "Export as text/csv file" );
    AddExportExtension( 0, "text", "txt" );
    AddExportExtension( 0, "csv", "csv" );

    ClearChannels();
    AddChannel( mMdioChannel, "MDIO", false );
    AddChannel( mMdcChannel, "MDC", false );
}